

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

Float __thiscall
pbrt::HairBxDF::PDF(HairBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
                   BxDFReflTransFlags sampleFlags)

{
  float *pfVar1;
  float *pfVar2;
  float *in_RDI;
  Float FVar3;
  double dVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  uint in_XMM1_Da;
  undefined1 auVar7 [64];
  undefined1 in_ZMM2 [64];
  uint in_XMM3_Da;
  array<float,_4> aVar9;
  Float in_stack_0000001c;
  HairBxDF *in_stack_00000020;
  Float cosThetap_o;
  Float sinThetap_o;
  int p;
  Float pdf;
  Float phi;
  array<float,_4> apPDF;
  Float gamma_t;
  Float sinGamma_t;
  Float etap;
  Float phi_i;
  Float cosTheta_i;
  Float sinTheta_i;
  Float gamma_o;
  Float phi_o;
  Float cosTheta_o;
  Float sinTheta_o;
  Float in_stack_ffffffffffffff44;
  float s;
  int p_00;
  float fVar10;
  Float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  uint local_94;
  float local_90;
  array<float,_4> local_88;
  float local_78;
  float local_74;
  float local_70;
  undefined4 local_6c;
  float local_68;
  float local_64;
  float local_60;
  undefined4 local_5c;
  float local_58;
  float local_54;
  ulong local_40;
  ulong local_30;
  uint local_28;
  ulong local_20;
  ulong local_10;
  uint local_8;
  undefined1 auVar8 [56];
  
  local_20 = vmovlpd_avx(in_ZMM0._0_16_);
  local_40 = vmovlpd_avx(in_ZMM2._0_16_);
  local_10._0_4_ = (float)local_20;
  local_54 = (float)local_10;
  local_30 = local_40;
  local_28 = in_XMM3_Da;
  fVar10 = (float)local_10;
  local_10 = local_20;
  local_8 = in_XMM1_Da;
  Sqr<float>(fVar10);
  p_00 = 0x3f800000;
  local_58 = SafeSqrt(0.0);
  dVar4 = std::atan2((double)(ulong)local_8,(double)(local_10 >> 0x20));
  local_5c = SUB84(dVar4,0);
  local_60 = SafeASin(0.0);
  local_64 = (float)local_30;
  Sqr<float>((float)local_30);
  local_68 = SafeSqrt(0.0);
  dVar4 = std::atan2((double)(ulong)local_28,(double)(local_30 >> 0x20));
  local_6c = SUB84(dVar4,0);
  fVar10 = in_RDI[1] * in_RDI[1];
  Sqr<float>(local_54);
  local_70 = SafeSqrt(0.0);
  local_70 = local_70 / local_58;
  auVar8 = (undefined1  [56])0x0;
  local_74 = *in_RDI / local_70;
  local_78 = SafeASin(0.0);
  auVar6 = (undefined1  [56])0x0;
  pfVar2 = in_RDI;
  aVar9 = ApPDF(in_stack_00000020,in_stack_0000001c);
  auVar7._0_8_ = aVar9.values._8_8_;
  auVar7._8_56_ = auVar8;
  auVar5._0_8_ = aVar9.values._0_8_;
  auVar5._8_56_ = auVar6;
  local_88.values._0_8_ = vmovlpd_avx(auVar5._0_16_);
  local_88.values._8_8_ = vmovlpd_avx(auVar7._0_16_);
  local_90 = 0.0;
  for (local_94 = 0; (int)local_94 < 3; local_94 = local_94 + 1) {
    if (local_94 == 0) {
      in_stack_ffffffffffffff64 = local_58 * pfVar2[0x11] + local_54 * pfVar2[0xe];
    }
    else if (local_94 == 1) {
      in_stack_ffffffffffffff64 = local_58 * pfVar2[0x10] - local_54 * pfVar2[0xd];
    }
    else {
      in_stack_ffffffffffffff64 = local_58;
      if (local_94 == 2) {
        in_stack_ffffffffffffff64 = local_58 * pfVar2[0x12] - local_54 * pfVar2[0xf];
      }
    }
    std::abs((int)in_RDI);
    FVar3 = Mp(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,(Float)((ulong)pfVar2 >> 0x20),
               SUB84(pfVar2,0),fVar10);
    pfVar1 = pstd::array<float,_4>::operator[](&local_88,(long)(int)local_94);
    s = FVar3 * *pfVar1;
    in_RDI = (float *)(ulong)local_94;
    FVar3 = Np(fVar10,p_00,s,FVar3,in_stack_ffffffffffffff44);
    local_90 = s * FVar3 + local_90;
  }
  FVar3 = Mp(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,(Float)((ulong)pfVar2 >> 0x20),
             SUB84(pfVar2,0),fVar10);
  pfVar2 = pstd::array<float,_4>::operator[](&local_88,3);
  return FVar3 * *pfVar2 * 0.15915494 + local_90;
}

Assistant:

PBRT_CPU_GPU Float HairBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                    BxDFReflTransFlags sampleFlags) const {
    // TODO? flags...

    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);
    Float gamma_o = SafeASin(h);

    // Compute hair coordinate system terms related to _wi_
    Float sinTheta_i = wi.x;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));
    Float phi_i = std::atan2(wi.z, wi.y);

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute PDF for $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF = ApPDF(cosTheta_o);

    // Compute PDF sum for hair scattering events
    Float phi = phi_i - phi_o;
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Compute $\sin\,\thetao$ and $\cos\,\thetao$ terms accounting for scales
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        }
        // Handle remainder of $p$ values for hair scale tilt
        else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos\,\thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);

        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(phi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    return pdf;
}